

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

bool __thiscall cs::compiler_type::is_left_associative(compiler_type *this,token_base *ptr)

{
  int iVar1;
  signal_types sVar2;
  undefined8 uVar3;
  compile_error *this_00;
  size_t sVar4;
  token_signal *in_RSI;
  string *in_stack_ffffffffffffff68;
  compile_error *in_stack_ffffffffffffff70;
  key_arg<cs::signal_types> *in_stack_ffffffffffffff88;
  allocator *paVar5;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  allocator in_stack_ffffffffffffff97;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  token_signal *local_10;
  
  if (in_RSI == (token_signal *)0x0) {
    local_45 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    paVar5 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Get the level of null token.",paVar5);
    compile_error::compile_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_45 = 0;
    __cxa_throw(uVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_10 = in_RSI;
  iVar1 = (*(in_RSI->super_token_base)._vptr_token_base[2])();
  if (iVar1 != 3) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Get the level of non-signal token.",(allocator *)&stack0xffffffffffffff97);
    compile_error::compile_error(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  sVar2 = token_signal::get_signal(local_10);
  sVar4 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
          ::count<cs::signal_types>
                    ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
                      *)CONCAT17(in_stack_ffffffffffffff97,
                                 CONCAT16(in_stack_ffffffffffffff96,
                                          CONCAT24(in_stack_ffffffffffffff94,sVar2))),
                     in_stack_ffffffffffffff88);
  return sVar4 != 0;
}

Assistant:

bool is_left_associative(token_base *ptr)
		{
			if (ptr == nullptr)
				throw compile_error("Get the level of null token.");
			if (ptr->get_type() != token_types::signal)
				throw compile_error("Get the level of non-signal token.");
			return signal_left_associative.count(static_cast<token_signal *>(ptr)->get_signal()) > 0;
		}